

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O1

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  long lVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar6 = 0;
    do {
      pauVar7 = (undefined1 (*) [16])
                (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar5 < 4) {
        uVar9 = 0;
      }
      else {
        fVar1 = (this->super_Clip).min;
        fVar2 = (this->super_Clip).max;
        iVar8 = 3;
        do {
          auVar11._4_4_ = fVar1;
          auVar11._0_4_ = fVar1;
          auVar11._8_4_ = fVar1;
          auVar11._12_4_ = fVar1;
          auVar11 = maxps(*pauVar7,auVar11);
          auVar4._4_4_ = fVar2;
          auVar4._0_4_ = fVar2;
          auVar4._8_4_ = fVar2;
          auVar4._12_4_ = fVar2;
          auVar11 = minps(auVar11,auVar4);
          *pauVar7 = auVar11;
          pauVar7 = pauVar7 + 1;
          iVar8 = iVar8 + 4;
          uVar9 = uVar5 & 0xfffffffc;
        } while (iVar8 < (int)uVar5);
      }
      if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
        lVar10 = 0;
        do {
          fVar1 = (this->super_Clip).min;
          if (*(float *)(*pauVar7 + lVar10 * 4) < fVar1) {
            *(float *)(*pauVar7 + lVar10 * 4) = fVar1;
          }
          fVar1 = (this->super_Clip).max;
          if (fVar1 < *(float *)(*pauVar7 + lVar10 * 4)) {
            *(float *)(*pauVar7 + lVar10 * 4) = fVar1;
          }
          lVar10 = lVar10 + 1;
        } while (uVar5 - uVar9 != (int)lVar10);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar3);
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}